

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multistream.h
# Opt level: O0

void __thiscall ipx::Multistream::~Multistream(Multistream *this)

{
  Multistream *in_stack_00000010;
  
  ~Multistream(in_stack_00000010);
  return;
}

Assistant:

Multistream() : std::ostream(nullptr) {
        std::ostream::rdbuf(&mbuffer_);
    }